

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_vdpu34x.c
# Opt level: O0

MPP_RET vdpu34x_h264d_deinit(void *hal)

{
  long lVar1;
  uint uVar2;
  uint local_24;
  RK_U32 loop;
  RK_U32 i;
  Vdpu34xH264dRegCtx *reg_ctx;
  H264dHalCtx_t *p_hal;
  void *hal_local;
  
  lVar1 = *(long *)((long)hal + 0x90);
  uVar2 = 1;
  if (*(int *)((long)hal + 0x98) != 0) {
    uVar2 = 3;
  }
  mpp_buffer_put_with_caller(*(MppBuffer *)(lVar1 + 0x310),"vdpu34x_h264d_deinit");
  for (local_24 = 0; local_24 < uVar2; local_24 = local_24 + 1) {
    if (*(long *)(lVar1 + (ulong)local_24 * 0x10 + 0x360) != 0) {
      mpp_osal_free("vdpu34x_h264d_deinit",*(void **)(lVar1 + (ulong)local_24 * 0x10 + 0x360));
    }
    *(undefined8 *)(lVar1 + (ulong)local_24 * 0x10 + 0x360) = 0;
  }
  uVar2 = 1;
  if (*(int *)((long)hal + 0x98) != 0) {
    uVar2 = 3;
  }
  for (local_24 = 0; local_24 < uVar2; local_24 = local_24 + 1) {
    if (*(long *)(lVar1 + 0x428 + (ulong)local_24 * 8) != 0) {
      mpp_buffer_put_with_caller
                (*(MppBuffer *)(lVar1 + 0x428 + (ulong)local_24 * 8),"vdpu34x_h264d_deinit");
      *(undefined8 *)(lVar1 + 0x428 + (ulong)local_24 * 8) = 0;
    }
  }
  if (*(long *)((long)hal + 0x70) != 0) {
    hal_bufs_deinit(*(HalBufs *)((long)hal + 0x70));
    *(undefined8 *)((long)hal + 0x70) = 0;
  }
  if (*(long *)((long)hal + 0x90) != 0) {
    mpp_osal_free("vdpu34x_h264d_deinit",*(void **)((long)hal + 0x90));
  }
  *(undefined8 *)((long)hal + 0x90) = 0;
  return MPP_OK;
}

Assistant:

MPP_RET vdpu34x_h264d_deinit(void *hal)
{
    H264dHalCtx_t *p_hal = (H264dHalCtx_t *)hal;
    Vdpu34xH264dRegCtx *reg_ctx = (Vdpu34xH264dRegCtx *)p_hal->reg_ctx;

    RK_U32 i = 0;
    RK_U32 loop = p_hal->fast_mode ? MPP_ARRAY_ELEMS(reg_ctx->reg_buf) : 1;

    mpp_buffer_put(reg_ctx->bufs);

    for (i = 0; i < loop; i++)
        MPP_FREE(reg_ctx->reg_buf[i].regs);

    loop = p_hal->fast_mode ? MPP_ARRAY_ELEMS(reg_ctx->rcb_buf) : 1;
    for (i = 0; i < loop; i++) {
        if (reg_ctx->rcb_buf[i]) {
            mpp_buffer_put(reg_ctx->rcb_buf[i]);
            reg_ctx->rcb_buf[i] = NULL;
        }
    }

    if (p_hal->cmv_bufs) {
        hal_bufs_deinit(p_hal->cmv_bufs);
        p_hal->cmv_bufs = NULL;
    }

    MPP_FREE(p_hal->reg_ctx);

    return MPP_OK;
}